

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O2

void write_timer(memfile *mf,timer_element *timer)

{
  int8_t value;
  int32_t value_00;
  void *pvVar1;
  
  if ((ushort)timer->kind < 2) {
    pvVar1 = timer->arg;
  }
  else {
    if (timer->kind != 2) {
      panic("write_timer");
    }
    pvVar1 = timer->arg;
    if ((timer->field_0x1b & 1) == 0) {
      value_00 = *(int32_t *)((long)pvVar1 + 0x18);
      value = '\x01';
      goto LAB_0024d7dd;
    }
  }
  value_00 = (int32_t)pvVar1;
  value = '\0';
LAB_0024d7dd:
  mtag(mf,(ulong)timer->tid,MTAG_TIMER);
  mwrite32(mf,timer->tid);
  mwrite32(mf,timer->timeout);
  mwrite32(mf,value_00);
  mwrite16(mf,timer->kind);
  mwrite8(mf,timer->func_index);
  mwrite8(mf,value);
  return;
}

Assistant:

static void write_timer(struct memfile *mf, timer_element *timer)
{
    long argval;
    boolean needs_fixup = FALSE;

    switch (timer->kind) {
	case TIMER_GLOBAL:
	case TIMER_LEVEL:
	    /* assume no pointers in arg */
	    argval = (long)timer->arg;
	    break;

	case TIMER_OBJECT:
	    if (timer->needs_fixup)
		argval = (long)timer->arg;
	    else {
		/* replace object pointer with id */
		argval = ((struct obj *)timer->arg)->o_id;
		needs_fixup = TRUE;
	    }
	    break;

	default:
	    panic("write_timer");
	    break;
    }

    mtag(mf, timer->tid, MTAG_TIMER);
    mwrite32(mf, timer->tid);
    mwrite32(mf, timer->timeout);
    mwrite32(mf, argval);
    mwrite16(mf, timer->kind);
    mwrite8(mf, timer->func_index);
    mwrite8(mf, needs_fixup);
}